

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::StochasticTask::~StochasticTask(StochasticTask *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~StochasticTask((StochasticTask *)0x9ae558);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

StochasticTask(KnownSystemName knownNameId, SubroutineKind subroutineKind, size_t inputArgs,
                   size_t outputArgs) :
        SystemSubroutine(knownNameId, subroutineKind), inputArgs(inputArgs),
        outputArgs(outputArgs) {
        hasOutputArgs = outputArgs > 0;
    }